

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IsGroupOf_PDU::~IsGroupOf_PDU(IsGroupOf_PDU *this)

{
  IsGroupOf_PDU *this_local;
  
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__IsGroupOf_PDU_0032ba10;
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ::clear(&this->m_vpGED);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
  ::~vector(&this->m_vpGED);
  DATA_TYPE::EntityIdentifier::~EntityIdentifier(&this->m_GroupedEntityID);
  Header7::~Header7(&this->super_Header);
  return;
}

Assistant:

IsGroupOf_PDU::~IsGroupOf_PDU()
{
    m_vpGED.clear();
}